

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# radix_partitioned_hashtable.cpp
# Opt level: O1

ProgressData * __thiscall
duckdb::RadixPartitionedHashTable::GetProgress
          (ProgressData *__return_storage_ptr__,RadixPartitionedHashTable *this,
          ClientContext *param_1,GlobalSinkState *sink_p,GlobalSourceState *gstate_p)

{
  double dVar1;
  pointer pIVar2;
  undefined8 uVar3;
  pointer pAVar4;
  long lVar5;
  long lVar6;
  unique_ptr<duckdb::AggregatePartition,_std::default_delete<duckdb::AggregatePartition>,_true>
  *partition;
  pointer this_00;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  
  __return_storage_ptr__->done = 0.0;
  __return_storage_ptr__->total = 0.0;
  __return_storage_ptr__->invalid = false;
  pIVar2 = sink_p[2].super_StateWithBlockableTasks.blocked_tasks.
           super_vector<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>.
           super__Vector_base<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage;
  for (this_00 = sink_p[2].super_StateWithBlockableTasks.blocked_tasks.
                 super_vector<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>.
                 super__Vector_base<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>
                 ._M_impl.super__Vector_impl_data._M_finish; this_00 != pIVar2;
      this_00 = (pointer)&this_00->current_task) {
    pAVar4 = unique_ptr<duckdb::AggregatePartition,_std::default_delete<duckdb::AggregatePartition>,_true>
             ::operator->((unique_ptr<duckdb::AggregatePartition,_std::default_delete<duckdb::AggregatePartition>,_true>
                           *)this_00);
    dVar1 = (pAVar4->progress)._M_i;
    __return_storage_ptr__->done = dVar1 + dVar1 + __return_storage_ptr__->done;
  }
  uVar3 = *(undefined8 *)
           ((long)&gstate_p[1].super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex + 0x20
           );
  auVar7._8_4_ = (int)((ulong)uVar3 >> 0x20);
  auVar7._0_8_ = uVar3;
  auVar7._12_4_ = 0x45300000;
  __return_storage_ptr__->done =
       (auVar7._8_8_ - 1.9342813113834067e+25) +
       ((double)CONCAT44(0x43300000,(int)uVar3) - 4503599627370496.0) + __return_storage_ptr__->done
  ;
  lVar5 = (long)sink_p[2].super_StateWithBlockableTasks.blocked_tasks.
                super_vector<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>.
                super__Vector_base<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage -
          (long)sink_p[2].super_StateWithBlockableTasks.blocked_tasks.
                super_vector<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>.
                super__Vector_base<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>.
                _M_impl.super__Vector_impl_data._M_finish;
  lVar6 = lVar5 >> 3;
  auVar8._8_4_ = (int)(lVar5 >> 0x23);
  auVar8._0_8_ = lVar6;
  auVar8._12_4_ = 0x45300000;
  __return_storage_ptr__->total =
       ((auVar8._8_8_ - 1.9342813113834067e+25) +
       ((double)CONCAT44(0x43300000,(int)lVar6) - 4503599627370496.0)) * 3.0 +
       __return_storage_ptr__->total;
  return __return_storage_ptr__;
}

Assistant:

ProgressData RadixPartitionedHashTable::GetProgress(ClientContext &, GlobalSinkState &sink_p,
                                                    GlobalSourceState &gstate_p) const {
	auto &sink = sink_p.Cast<RadixHTGlobalSinkState>();
	auto &gstate = gstate_p.Cast<RadixHTGlobalSourceState>();

	// Get partition combine progress, weigh it 2x
	ProgressData progress;
	for (auto &partition : sink.partitions) {
		progress.done += 2.0 * partition->progress;
	}

	// Get scan progress, weigh it 1x
	progress.done += 1.0 * double(gstate.task_done);

	// Divide by 3x for the weights, and the number of partitions to get a value between 0 and 1 again
	progress.total += 3.0 * double(sink.partitions.size());

	return progress;
}